

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.cpp
# Opt level: O0

bool __thiscall
sf::priv::ImageLoader::loadImageFromFile
          (ImageLoader *this,string *filename,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pixels,Vector2u *size)

{
  stbi_uc *__src;
  reference __dest;
  size_type __n;
  ostream *poVar1;
  char *pcVar2;
  int *in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  string *in_RSI;
  uchar *ptr;
  int channels;
  int height;
  int width;
  undefined8 in_stack_ffffffffffffffb8;
  int req_comp;
  int *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  bool local_1;
  
  req_comp = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ee3f2);
  iVar5 = 0;
  iVar4 = 0;
  uVar3 = 0;
  std::__cxx11::string::c_str();
  __src = stbi_load((char *)in_RCX,(int *)CONCAT44(iVar5,iVar4),
                    (int *)CONCAT44(uVar3,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0,
                    req_comp);
  if (__src == (stbi_uc *)0x0) {
    poVar1 = err();
    poVar1 = std::operator<<(poVar1,"Failed to load image \"");
    poVar1 = std::operator<<(poVar1,in_RSI);
    poVar1 = std::operator<<(poVar1,"\". Reason: ");
    pcVar2 = stbi_failure_reason();
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  else {
    *in_RCX = iVar5;
    in_RCX[1] = iVar4;
    if ((0 < iVar5) && (0 < iVar4)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(iVar5,iVar4),
                 CONCAT44(uVar3,in_stack_ffffffffffffffc8));
      __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RDX,0);
      __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDX);
      memcpy(__dest,__src,__n);
    }
    stbi_image_free((void *)0x1ee4c3);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ImageLoader::loadImageFromFile(const std::string& filename, std::vector<Uint8>& pixels, Vector2u& size)
{
    // Clear the array (just in case)
    pixels.clear();

    // Load the image and get a pointer to the pixels in memory
    int width = 0;
    int height = 0;
    int channels = 0;
    unsigned char* ptr = stbi_load(filename.c_str(), &width, &height, &channels, STBI_rgb_alpha);

    if (ptr)
    {
        // Assign the image properties
        size.x = static_cast<unsigned int>(width);
        size.y = static_cast<unsigned int>(height);

        if (width > 0 && height > 0)
        {
            // Copy the loaded pixels to the pixel buffer
            pixels.resize(static_cast<std::size_t>(width * height * 4));
            memcpy(&pixels[0], ptr, pixels.size());
        }

        // Free the loaded pixels (they are now in our own pixel buffer)
        stbi_image_free(ptr);

        return true;
    }
    else
    {
        // Error, failed to load the image
        err() << "Failed to load image \"" << filename << "\". Reason: " << stbi_failure_reason() << std::endl;

        return false;
    }
}